

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void custom_format<int>(char *format_str,int *args)

{
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_int>
  va;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  in_stack_00000228;
  string_view in_stack_00000238;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_int>
  *in_stack_ffffffffffffffb8;
  basic_string_view<char> *in_stack_ffffffffffffffc0;
  
  fmt::v5::
  make_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
            ((int *)in_stack_ffffffffffffffb8);
  fmt::v5::basic_string_view<char>::basic_string_view
            (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
  fmt::v5::format_args::
  format_args<fmt::v5::format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>&>
            ((format_args *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  custom_vformat(in_stack_00000238,(format_args)in_stack_00000228);
  return;
}

Assistant:

void custom_format(const char *format_str, const Args & ... args) {
  auto va = fmt::make_format_args(args...);
  return custom_vformat(format_str, va);
}